

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

ngx_int_t ngx_rstrncmp(u_char *s1,u_char *s2,size_t n)

{
  if (n != 0) {
    do {
      if (s1[n - 1] != s2[n - 1]) {
        return (ulong)s1[n - 1] - (ulong)s2[n - 1];
      }
      n = n - 1;
    } while (n != 0);
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_rstrncmp(u_char *s1, u_char *s2, size_t n)
{
    if (n == 0) {
        return 0;
    }

    n--;

    for ( ;; ) {
        if (s1[n] != s2[n]) {
            return s1[n] - s2[n];
        }

        if (n == 0) {
            return 0;
        }

        n--;
    }
}